

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  char *pcVar8;
  size_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *pcVar11;
  _Alloc_hider __len1;
  size_type __len2;
  undefined1 auVar12 [8];
  undefined1 local_b0 [8];
  string negative;
  long local_80;
  string local_70;
  undefined1 local_50 [8];
  string positive;
  
  psVar1 = &positive._M_string_length;
  pcVar3 = (test_case_name->_M_dataplus)._M_p;
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + test_case_name->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,".");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                      (test_name->_M_dataplus)._M_p);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if (paVar4 == paVar10) {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)paVar4;
  }
  local_70._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50,
                    CONCAT71(positive._M_string_length._1_7_,(undefined1)positive._M_string_length)
                    + 1);
  }
  pcVar11 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar8 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  positive._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  psVar2 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  negative._M_string_length._0_1_ = 0;
  local_b0 = (undefined1  [8])psVar2;
  if (pcVar8 == (char *)0x0) {
    local_50 = (undefined1  [8])psVar1;
    sVar9 = strlen(pcVar11);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,0,0,
               pcVar11,sVar9);
    pcVar11 = "";
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
    __len2 = 0;
    __len1 = negative._M_dataplus;
  }
  else {
    negative.field_2._8_8_ = &stack0xffffffffffffff80;
    local_50 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&negative.field_2 + 8),pcVar11,pcVar8);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&negative.field_2 + 8));
    if ((long *)negative.field_2._8_8_ != &stack0xffffffffffffff80) {
      operator_delete((void *)negative.field_2._8_8_,local_80 + 1);
    }
    negative.field_2._8_8_ = &stack0xffffffffffffff80;
    sVar9 = strlen(pcVar8 + 1);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&negative.field_2 + 8),pcVar8 + 1,pcVar8 + sVar9 + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&negative.field_2 + 8));
    if ((long *)negative.field_2._8_8_ != &stack0xffffffffffffff80) {
      operator_delete((void *)negative.field_2._8_8_,local_80 + 1);
    }
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_00a34c6c;
    __len2 = 1;
    pcVar11 = "*";
    __len1._M_p = (pointer)0x0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (pbVar7,0,(size_type)__len1._M_p,pcVar11,__len2);
LAB_00a34c6c:
  auVar12 = local_50;
  bVar6 = MatchesFilter(&local_70,(char *)local_50);
  auVar5 = local_b0;
  if (bVar6) {
    bVar6 = MatchesFilter(&local_70,(char *)local_b0);
    bVar6 = !bVar6;
  }
  else {
    bVar6 = false;
  }
  if (auVar5 != (undefined1  [8])psVar2) {
    operator_delete((void *)auVar5,
                    CONCAT71(negative._M_string_length._1_7_,(undefined1)negative._M_string_length)
                    + 1);
    auVar12 = local_50;
  }
  if (auVar12 != (undefined1  [8])psVar1) {
    operator_delete((void *)auVar12,
                    CONCAT71(positive._M_string_length._1_7_,(undefined1)positive._M_string_length)
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}